

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall icu_63::DecimalFormat::touch(DecimalFormat *this,UErrorCode *status)

{
  atomic<icu_63::numparse::impl::NumberParserImpl_*> *paVar1;
  __pointer_type pNVar2;
  DecimalFormatFields *pDVar3;
  DecimalFormatProperties *pDVar4;
  LocalizedNumberFormatter *__return_storage_ptr__;
  Locale *other;
  LocalPointer<const_icu_63::number::LocalizedNumberFormatter> *this_00;
  Locale locale;
  UnlocalizedNumberFormatter UStack_2c8;
  Locale local_100;
  
  if ((this->fields->exportedProperties).
      super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr !=
      (DecimalFormatProperties *)0x0) {
    other = &((this->fields->symbols).super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr
             )->locale;
    Locale::Locale(&local_100,other);
    this_00 = &this->fields->formatter;
    __return_storage_ptr__ =
         (LocalizedNumberFormatter *)UMemory::operator_new((UMemory *)0x1d0,(size_t)other);
    if (__return_storage_ptr__ == (LocalizedNumberFormatter *)0x0) {
      LocalPointer<const_icu_63::number::LocalizedNumberFormatter>::adoptInstead
                (this_00,(LocalizedNumberFormatter *)0x0);
    }
    else {
      pDVar3 = this->fields;
      icu_63::number::impl::NumberPropertyMapper::create
                (&UStack_2c8,
                 (pDVar3->properties).
                 super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr,
                 (pDVar3->symbols).super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr,
                 &pDVar3->warehouse,
                 (pDVar3->exportedProperties).
                 super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr,status);
      icu_63::number::UnlocalizedNumberFormatter::locale
                (__return_storage_ptr__,&UStack_2c8,&local_100);
      LocalPointer<const_icu_63::number::LocalizedNumberFormatter>::adoptInstead
                (this_00,__return_storage_ptr__);
      Locale::~Locale(&UStack_2c8.
                       super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>.
                       fMacros.locale);
      icu_63::number::Scale::~Scale
                (&UStack_2c8.
                  super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>.fMacros.
                  scale);
      icu_63::number::impl::SymbolsWrapper::~SymbolsWrapper
                (&UStack_2c8.
                  super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>.fMacros.
                  symbols);
      MeasureUnit::~MeasureUnit
                (&UStack_2c8.
                  super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>.fMacros.
                  perUnit);
      MeasureUnit::~MeasureUnit
                (&UStack_2c8.
                  super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>.fMacros.
                  unit);
    }
    setupFastFormat(this);
    LOCK();
    paVar1 = &this->fields->atomicParser;
    pNVar2 = (paVar1->_M_b)._M_p;
    (paVar1->_M_b)._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (pNVar2 != (__pointer_type)0x0) {
      (*(pNVar2->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[1])();
    }
    LOCK();
    paVar1 = &this->fields->atomicCurrencyParser;
    pNVar2 = (paVar1->_M_b)._M_p;
    (paVar1->_M_b)._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (pNVar2 != (__pointer_type)0x0) {
      (*(pNVar2->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[1])();
    }
    pDVar4 = (this->fields->exportedProperties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
    if ((pDVar4->currency).fNull == true) {
      *status = U_UNDEFINED_VARIABLE;
    }
    CurrencyUnit::CurrencyUnit((CurrencyUnit *)&UStack_2c8,&(pDVar4->currency).fValue);
    NumberFormat::setCurrency
              (&this->super_NumberFormat,
               (UChar *)((long)&UStack_2c8.
                                super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
                                .fMacros.unit.super_UObject._vptr_UObject + 4),status);
    CurrencyUnit::~CurrencyUnit((CurrencyUnit *)&UStack_2c8);
    NumberFormat::setMaximumIntegerDigits
              (&this->super_NumberFormat,
               ((this->fields->exportedProperties).
                super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
               maximumIntegerDigits);
    NumberFormat::setMinimumIntegerDigits
              (&this->super_NumberFormat,
               ((this->fields->exportedProperties).
                super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
               minimumIntegerDigits);
    NumberFormat::setMaximumFractionDigits
              (&this->super_NumberFormat,
               ((this->fields->exportedProperties).
                super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
               maximumFractionDigits);
    NumberFormat::setMinimumFractionDigits
              (&this->super_NumberFormat,
               ((this->fields->exportedProperties).
                super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
               minimumFractionDigits);
    NumberFormat::setGroupingUsed
              (&this->super_NumberFormat,
               ((this->fields->properties).
                super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
               groupingUsed);
    Locale::~Locale(&local_100);
  }
  return;
}

Assistant:

void DecimalFormat::touch(UErrorCode& status) {
    if (fields->exportedProperties == nullptr) {
        // fields->exportedProperties is null only when the formatter is not ready yet.
        // The only time when this happens is during legacy deserialization.
        return;
    }

    // In C++, fields->symbols is the source of truth for the locale.
    Locale locale = fields->symbols->getLocale();

    // Note: The formatter is relatively cheap to create, and we need it to populate fields->exportedProperties,
    // so automatically compute it here. The parser is a bit more expensive and is not needed until the
    // parse method is called, so defer that until needed.
    // TODO: Only update the pieces that changed instead of re-computing the whole formatter?
    fields->formatter.adoptInstead(
            new LocalizedNumberFormatter(
                    NumberPropertyMapper::create(
                            *fields->properties, *fields->symbols, fields->warehouse, *fields->exportedProperties, status).locale(
                            locale)));

    // Do this after fields->exportedProperties are set up
    setupFastFormat();

    // Delete the parsers if they were made previously
    delete fields->atomicParser.exchange(nullptr);
    delete fields->atomicCurrencyParser.exchange(nullptr);

    // In order for the getters to work, we need to populate some fields in NumberFormat.
    NumberFormat::setCurrency(fields->exportedProperties->currency.get(status).getISOCurrency(), status);
    NumberFormat::setMaximumIntegerDigits(fields->exportedProperties->maximumIntegerDigits);
    NumberFormat::setMinimumIntegerDigits(fields->exportedProperties->minimumIntegerDigits);
    NumberFormat::setMaximumFractionDigits(fields->exportedProperties->maximumFractionDigits);
    NumberFormat::setMinimumFractionDigits(fields->exportedProperties->minimumFractionDigits);
    // fImpl->properties, not fields->exportedProperties, since this information comes from the pattern:
    NumberFormat::setGroupingUsed(fields->properties->groupingUsed);
}